

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::GenerateNodeGraph
          (LWOImporter *this,
          map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
          *apcNodes)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  uint uVar3;
  _Base_ptr p_Var4;
  mapped_type paVar5;
  aiNode **ppaVar6;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  *this_00;
  SharedPostProcessInfo *pSVar7;
  aiNode *paVar8;
  aiNode *paVar9;
  iterator iVar10;
  mapped_type *ppaVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  DeadlyImportError *this_01;
  aiNode *paVar15;
  ulong uVar16;
  uint16_t parentIndex;
  allocator local_b9;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  *local_b8;
  MakeLeftHandedProcess maker;
  FlipWindingOrderProcess flipper;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  mapPivot;
  
  paVar8 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar8);
  this->pScene->mRootNode = paVar8;
  aiString::Set((aiString *)paVar8,"<LWORoot>");
  mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapPivot._M_t._M_impl.super__Rb_tree_header._M_header;
  mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapPivot._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(apcNodes->_M_t)._M_impl.super__Rb_tree_header;
  p_Var12 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8 = &apcNodes->_M_t;
  mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; this_00 = local_b8, (_Rb_tree_header *)p_Var12 != p_Var1;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    p_Var4 = p_Var12[1]._M_parent[0x22]._M_parent;
    parentIndex = (uint16_t)p_Var4[9]._M_color;
    paVar9 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar9);
    std::__cxx11::string::string((string *)&flipper,&(p_Var12[1]._M_parent)->field_0x4,&local_b9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maker,
                   "Pivot-",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &flipper);
    pSVar7 = maker.super_BaseProcess.shared;
    if (maker.super_BaseProcess.shared < (SharedPostProcessInfo *)0x400) {
      (paVar9->mName).length = (ai_uint32)maker.super_BaseProcess.shared;
      memcpy((paVar9->mName).data,
             (void *)CONCAT62(maker.super_BaseProcess._vptr_BaseProcess._2_6_,
                              (short)maker.super_BaseProcess._vptr_BaseProcess),
             (size_t)maker.super_BaseProcess.shared);
      (paVar9->mName).data[(long)pSVar7] = '\0';
    }
    std::__cxx11::string::~string((string *)&maker);
    std::__cxx11::string::~string((string *)&flipper);
    p_Var12[1]._M_parent[0x22]._M_parent = (_Base_ptr)paVar9;
    iVar10 = std::
             _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
             ::find(local_b8,&parentIndex);
    paVar15 = paVar8;
    if ((_Rb_tree_header *)iVar10._M_node != p_Var1) {
      ppaVar11 = std::
                 map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                 ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                               *)local_b8,&parentIndex);
      paVar15 = *ppaVar11;
    }
    paVar9->mParent = paVar15;
    *(uint *)&p_Var12[1]._M_parent[0x20]._M_left = *(uint *)&p_Var4[10]._M_parent ^ 0x80000000;
    p_Var12[1]._M_parent[0x21]._M_color =
         *(_Rb_tree_color *)((long)&p_Var4[10]._M_parent + 4) ^ 0x80000000;
    *(uint *)&p_Var12[1]._M_parent[0x21]._M_left = *(uint *)&p_Var4[10]._M_left ^ 0x80000000;
    (paVar9->mTransformation).a4 = *(float *)&p_Var4[10]._M_parent;
    (paVar9->mTransformation).b4 = *(float *)((long)&p_Var4[10]._M_parent + 4);
    (paVar9->mTransformation).c4 = *(float *)&p_Var4[10]._M_left;
    maker.super_BaseProcess._vptr_BaseProcess._0_2_ = -2 - (short)p_Var12[1]._M_color;
    ppaVar11 = std::
               map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
               ::operator[](&mapPivot,(key_type_conflict *)&maker);
    *ppaVar11 = paVar9;
  }
  for (p_Var12 = mapPivot._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &mapPivot._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    paVar5 = (mapped_type)p_Var12[1]._M_parent;
    ppaVar11 = std::
               map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
               ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                             *)this_00,(key_type_conflict *)(p_Var12 + 1));
    *ppaVar11 = paVar5;
  }
  maker.super_BaseProcess._vptr_BaseProcess._0_2_ = 0xffff;
  ppaVar11 = std::
             map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
             ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                           *)this_00,(key_type_conflict *)&maker);
  *ppaVar11 = paVar8;
  for (p_Var14 = (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var14 != p_Var1;
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
    for (p_Var13 = (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                   _M_left; (_Rb_tree_header *)p_Var13 != p_Var1;
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      if (((short)p_Var14[1]._M_color != (short)p_Var13[1]._M_color) &&
         (p_Var14[1]._M_parent == p_Var13[1]._M_parent[0x22]._M_parent)) {
        pp_Var2 = &p_Var14[1]._M_parent[0x22]._M_left;
        *(int *)pp_Var2 = *(int *)pp_Var2 + 1;
      }
    }
    uVar16 = (ulong)*(uint *)&p_Var14[1]._M_parent[0x22]._M_left;
    if (uVar16 != 0) {
      p_Var12 = (_Base_ptr)operator_new__(uVar16 << 3);
      p_Var14[1]._M_parent[0x22]._M_right = p_Var12;
      uVar16 = 0;
      for (p_Var13 = (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                     _M_left; (_Rb_tree_header *)p_Var13 != p_Var1;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        if ((short)p_Var14[1]._M_color != (short)p_Var13[1]._M_color) {
          if (p_Var14[1]._M_parent == p_Var13[1]._M_parent[0x22]._M_parent) {
            *(_Base_ptr *)(&(p_Var14[1]._M_parent[0x22]._M_right)->_M_color + (uVar16 & 0xffff) * 2)
                 = p_Var13[1]._M_parent;
            uVar16 = (ulong)((int)uVar16 + 1);
          }
        }
      }
    }
  }
  paVar8 = this->pScene->mRootNode;
  uVar3 = paVar8->mNumChildren;
  if (uVar3 == 1) {
    ppaVar6 = paVar8->mChildren;
    paVar8 = *ppaVar6;
    *ppaVar6 = (aiNode *)0x0;
    paVar8->mParent = (aiNode *)0x0;
    paVar9 = this->pScene->mRootNode;
    if (paVar9 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar9);
    }
    operator_delete(paVar9);
    this->pScene->mRootNode = paVar8;
  }
  else if (uVar3 == 0) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&maker,"LWO: Unable to build a valid node graph",(allocator *)&flipper);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&maker);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess(&maker);
  MakeLeftHandedProcess::Execute(&maker,this->pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&flipper);
  FlipWindingOrderProcess::Execute(&flipper,this->pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&flipper);
  MakeLeftHandedProcess::~MakeLeftHandedProcess(&maker);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  ::~_Rb_tree(&mapPivot._M_t);
  return;
}

Assistant:

void LWOImporter::GenerateNodeGraph(std::map<uint16_t,aiNode*>& apcNodes)
{
    // now generate the final nodegraph - generate a root node and attach children
    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<LWORoot>");

    //Set parent of all children, inserting pivots
    //std::cout << "Set parent of all children" << std::endl;
    std::map<uint16_t, aiNode*> mapPivot;
    for (auto itapcNodes = apcNodes.begin(); itapcNodes != apcNodes.end(); ++itapcNodes) {

        //Get the parent index
        LWO::Layer* nodeLayer = (LWO::Layer*)(itapcNodes->second->mParent);
        uint16_t parentIndex = nodeLayer->mParent;

        //Create pivot node, store it into the pivot map, and set the parent as the pivot
        aiNode* pivotNode = new aiNode();
        pivotNode->mName.Set("Pivot-"+std::string(itapcNodes->second->mName.data));
        itapcNodes->second->mParent = pivotNode;

        //Look for the parent node to attach the pivot to
        if (apcNodes.find(parentIndex) != apcNodes.end()) {
            pivotNode->mParent = apcNodes[parentIndex];
        } else {
            //If not, attach to the root node
            pivotNode->mParent = root;
        }

        //Set the node and the pivot node transformation
        itapcNodes->second->mTransformation.a4 = -nodeLayer->mPivot.x;
        itapcNodes->second->mTransformation.b4 = -nodeLayer->mPivot.y;
        itapcNodes->second->mTransformation.c4 = -nodeLayer->mPivot.z;
        pivotNode->mTransformation.a4 = nodeLayer->mPivot.x;
        pivotNode->mTransformation.b4 = nodeLayer->mPivot.y;
        pivotNode->mTransformation.c4 = nodeLayer->mPivot.z;
        mapPivot[-(itapcNodes->first+2)] = pivotNode;
    }

    //Merge pivot map into node map
    //std::cout << "Merge pivot map into node map" << std::endl;
    for (auto itMapPivot = mapPivot.begin(); itMapPivot != mapPivot.end(); ++itMapPivot) {
        apcNodes[itMapPivot->first] = itMapPivot->second;
    }

    //Set children of all parents
    apcNodes[-1] = root;
    for (auto itMapParentNodes = apcNodes.begin(); itMapParentNodes != apcNodes.end(); ++itMapParentNodes) {
        for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
            if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                ++(itMapParentNodes->second->mNumChildren);
            }
        }
        if (itMapParentNodes->second->mNumChildren) {
            itMapParentNodes->second->mChildren = new aiNode* [ itMapParentNodes->second->mNumChildren ];
            uint16_t p = 0;
            for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
                if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                    itMapParentNodes->second->mChildren[p++] = itMapChildNodes->second;
                }
            }
        }
    }

    if (!pScene->mRootNode->mNumChildren)
        throw DeadlyImportError("LWO: Unable to build a valid node graph");

    // Remove a single root node with no meshes assigned to it ...
    if (1 == pScene->mRootNode->mNumChildren)   {
        aiNode* pc = pScene->mRootNode->mChildren[0];
        pc->mParent = pScene->mRootNode->mChildren[0] = NULL;
        delete pScene->mRootNode;
        pScene->mRootNode = pc;
    }

    // convert the whole stuff to RH with CCW winding
    MakeLeftHandedProcess maker;
    maker.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}